

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::PathTypeSingleSuccessorInfo::SetSuccessor
          (PathTypeSingleSuccessorInfo *this,DynamicType *type,PathTypeSuccessorKey key,
          RecyclerWeakReference<Js::DynamicType> *typeWeakRef,ScriptContext *scriptContext)

{
  PathTypeSuccessorKey key_00;
  code *pcVar1;
  bool bVar2;
  RecyclerWeakReference<Js::DynamicType> **ppRVar3;
  RecyclerWeakReference<Js::DynamicType> *this_00;
  DynamicType *pDVar4;
  undefined4 *puVar5;
  PathTypeMultiSuccessorInfo *this_01;
  DynamicTypeHandler *pDVar6;
  PathTypeHandlerBase *pPVar7;
  PathTypeSingleSuccessorInfo *pPVar8;
  PathTypeMultiSuccessorInfo *newInfo;
  ScriptContext *scriptContext_local;
  RecyclerWeakReference<Js::DynamicType> *typeWeakRef_local;
  DynamicType *type_local;
  PathTypeSingleSuccessorInfo *this_local;
  PathTypeSuccessorKey key_local;
  
  this_local = (PathTypeSingleSuccessorInfo *)key;
  ppRVar3 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                      ((WriteBarrierPtr *)&this->successorTypeWeakRef);
  if (*ppRVar3 != (RecyclerWeakReference<Js::DynamicType> *)0x0) {
    this_00 = Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>::operator->
                        (&this->successorTypeWeakRef);
    pDVar4 = Memory::RecyclerWeakReference<Js::DynamicType>::Get(this_00);
    if (pDVar4 != (DynamicType *)0x0) {
      bVar2 = PathTypeSuccessorKey::operator!=
                        ((PathTypeSuccessorKey *)&this_local,&this->successorKey);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                    ,0x9c,"(key != successorKey)","key != successorKey");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      key_00.propertyId = (this->successorKey).propertyId;
      key_00.attributes = (this->successorKey).attributes;
      key_00._5_3_ = *(undefined3 *)&(this->successorKey).field_0x5;
      ppRVar3 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                          ((WriteBarrierPtr *)&this->successorTypeWeakRef);
      this_01 = PathTypeMultiSuccessorInfo::New(key_00,*ppRVar3,scriptContext);
      PathTypeMultiSuccessorInfo::SetSuccessor
                (this_01,type,(PathTypeSuccessorKey)this_local,typeWeakRef,scriptContext);
      pDVar6 = DynamicType::GetTypeHandler(type);
      pPVar7 = PathTypeHandlerBase::FromTypeHandler(pDVar6);
      pPVar8 = (PathTypeSingleSuccessorInfo *)PathTypeHandlerBase::GetSuccessorInfo(pPVar7);
      if (pPVar8 != this) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                    ,0xa1,
                                    "(PathTypeHandlerBase::FromTypeHandler(type->GetTypeHandler())->GetSuccessorInfo() == this)"
                                    ,
                                    "PathTypeHandlerBase::FromTypeHandler(type->GetTypeHandler())->GetSuccessorInfo() == this"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      pDVar6 = DynamicType::GetTypeHandler(type);
      pPVar7 = PathTypeHandlerBase::FromTypeHandler(pDVar6);
      PathTypeHandlerBase::SetSuccessorInfo(pPVar7,&this_01->super_PathTypeSuccessorInfo);
      scriptContext->convertSimplePathToPathCount = scriptContext->convertSimplePathToPathCount + 1;
      return;
    }
  }
  (this->successorKey).propertyId = (Type)this_local;
  (this->successorKey).attributes = this_local._4_1_;
  Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>::operator=
            (&this->successorTypeWeakRef,typeWeakRef);
  return;
}

Assistant:

void PathTypeSingleSuccessorInfo::SetSuccessor(DynamicType * type, const PathTypeSuccessorKey key, RecyclerWeakReference<DynamicType> * typeWeakRef, ScriptContext * scriptContext)
    {
        if (!successorTypeWeakRef || !successorTypeWeakRef->Get())
        {
            successorKey = key;
            successorTypeWeakRef = typeWeakRef;
            return;
        }

        Assert(key != successorKey);

        PathTypeMultiSuccessorInfo * newInfo = PathTypeMultiSuccessorInfo::New(this->successorKey, this->successorTypeWeakRef, scriptContext);
        newInfo->SetSuccessor(type, key, typeWeakRef, scriptContext);

        Assert(PathTypeHandlerBase::FromTypeHandler(type->GetTypeHandler())->GetSuccessorInfo() == this);
        PathTypeHandlerBase::FromTypeHandler(type->GetTypeHandler())->SetSuccessorInfo(newInfo);

#ifdef PROFILE_TYPES
        scriptContext->convertSimplePathToPathCount++;
#endif
    }